

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRMeshLoader.cpp
# Opt level: O0

void __thiscall
Assimp::IRRMeshImporter::InternReadFile
          (IRRMeshImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *this_00;
  float fVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  IOStream *__p;
  pointer pIVar5;
  DeadlyImportError *pDVar6;
  IrrXMLReader *pIVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  aiMesh *paVar8;
  ulong *puVar9;
  ulong uVar10;
  aiVector3D *paVar11;
  size_type sVar12;
  aiColor4D *paVar13;
  float extraout_var_04;
  reference other;
  reference pvVar14;
  reference pvVar15;
  Logger *pLVar16;
  size_type sVar17;
  aiMesh **ppaVar18;
  reference ppaVar19;
  aiMaterial **ppaVar20;
  reference __src;
  aiNode *this_01;
  uint *puVar21;
  aiFace *paVar22;
  bool local_59d;
  aiVector3t<float> *local_548;
  aiVector3t<float> *local_518;
  aiColor4t<float> *local_4e8;
  aiVector3t<float> *local_4b8;
  aiVector3t<float> *local_488;
  aiVector3t<float> *local_458;
  aiVector3t<float> *local_428;
  aiFace *local_400;
  uint local_2e4;
  uint local_2e0;
  uint i_1;
  uint i;
  aiMesh *local_2b8;
  aiMaterial *mat_1;
  uint local_2a8;
  uint idx_1;
  uint total;
  uint curIdx;
  aiVector3D *pcT1;
  aiVector3D *pcT0;
  aiColor4D *pcC0;
  aiVector3D *pcB;
  aiVector3D *pcT;
  aiVector3D *pcN;
  aiVector3D *pcV;
  aiFace *faceEnd;
  aiFace *curFace;
  __normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_250;
  uint local_248;
  undefined1 local_244 [4];
  uint32_t clr;
  aiColor4D c;
  aiVector3D temp;
  char *sz;
  string local_218;
  aiMesh *local_1f8;
  aiMaterial *mat;
  char *pcStack_1e8;
  int idx;
  char *t;
  int num;
  int iStack_1d4;
  bool useColors;
  int vertexFormat;
  int textMeaning;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUV2s;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUVs;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> curColors;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curBitangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curTangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curNormals;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curVertices;
  aiMesh *paStack_120;
  uint curMatFlags;
  aiMesh *curMesh;
  aiMaterial *curMat;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> materials;
  CIrrXML_IOStreamReader st;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  IRRMeshImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar5 == (pointer)0x0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open IRRMESH file ",pFile);
    std::operator+(&local_88,&local_a8,"");
    DeadlyImportError::DeadlyImportError(pDVar6,&local_88);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader
            ((CIrrXML_IOStreamReader *)
             &materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pIVar5);
  pIVar7 = irr::io::createIrrXMLReader
                     ((IFileReadCallBack *)
                      &materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  (this->super_IrrlichtBase).reader = pIVar7;
  this_00 = &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector
            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this_00);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&curMat);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this_00,5);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&curMat,5);
  curMesh = (aiMesh *)0x0;
  paStack_120 = (aiMesh *)0x0;
  curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &curNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &curTangents.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &curBitangents.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &curColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &curUVs.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &curUV2s.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&vertexFormat);
  iStack_1d4 = 0;
  num = 0;
  t._7_1_ = 0;
  do {
    do {
      while( true ) {
        do {
          while( true ) {
            uVar3 = (*((this->super_IrrlichtBase).reader)->_vptr_IIrrXMLReader[2])();
            if ((uVar3 & 1) == 0) {
              if ((curMesh != (aiMesh *)0x0) || (paStack_120 != (aiMesh *)0x0)) {
                if ((curMesh == (aiMesh *)0x0) || (paStack_120 == (aiMesh *)0x0)) {
                  pLVar16 = DefaultLogger::get();
                  Logger::error(pLVar16,"IRRMESH: A buffer must contain a mesh and a material");
                  releaseMaterial((aiMaterial **)&curMesh);
                  releaseMesh(&stack0xfffffffffffffee0);
                }
                else {
                  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                             &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage,(value_type *)&curMesh);
                  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&curMat,
                             &stack0xfffffffffffffee0);
                }
              }
              bVar2 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::empty
                                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                                 &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar2) {
                i_1._2_1_ = 1;
                pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&i,"IRRMESH: Unable to read a mesh from this file",
                           (allocator *)((long)&i_1 + 3));
                DeadlyImportError::DeadlyImportError(pDVar6,(string *)&i);
                i_1._2_1_ = 0;
                __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,
                            DeadlyImportError::~DeadlyImportError);
              }
              sVar17 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                                 ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&curMat);
              pScene->mNumMeshes = (uint)sVar17;
              ppaVar18 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
              pScene->mMeshes = ppaVar18;
              for (local_2e0 = 0; local_2e0 < pScene->mNumMeshes; local_2e0 = local_2e0 + 1) {
                ppaVar19 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                                     ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&curMat,
                                      (ulong)local_2e0);
                pScene->mMeshes[local_2e0] = *ppaVar19;
                pScene->mMeshes[local_2e0]->mNumUVComponents[3] = 0;
              }
              sVar17 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                                 ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                                  &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
              pScene->mNumMaterials = (uint)sVar17;
              ppaVar20 = (aiMaterial **)operator_new__((ulong)pScene->mNumMaterials << 3);
              pScene->mMaterials = ppaVar20;
              ppaVar20 = pScene->mMaterials;
              __src = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                                 &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,0);
              memcpy(ppaVar20,__src,(ulong)pScene->mNumMaterials << 3);
              this_01 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(this_01);
              pScene->mRootNode = this_01;
              aiString::Set(&pScene->mRootNode->mName,"<IRRMesh>");
              pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
              puVar21 = (uint *)operator_new__((ulong)pScene->mNumMeshes << 2);
              pScene->mRootNode->mMeshes = puVar21;
              for (local_2e4 = 0; local_2e4 < pScene->mNumMeshes; local_2e4 = local_2e4 + 1) {
                pScene->mRootNode->mMeshes[local_2e4] = local_2e4;
              }
              pIVar7 = (this->super_IrrlichtBase).reader;
              if (pIVar7 != (IrrXMLReader *)0x0) {
                (*pIVar7->_vptr_IIrrXMLReader[1])();
              }
              (this->super_IrrlichtBase).reader = (IrrXMLReader *)0x0;
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &vertexFormat);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curUV2s.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector
                        ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                         &curUVs.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curColors.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curBitangents.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curTangents.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curNormals.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&curMat);
              std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector
                        ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                         &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              CIrrXML_IOStreamReader::~CIrrXML_IOStreamReader
                        ((CIrrXML_IOStreamReader *)
                         &materials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                        (&local_30);
              return;
            }
            iVar4 = (*((this->super_IrrlichtBase).reader)->_vptr_IIrrXMLReader[3])();
            if (iVar4 != 1) break;
            iVar4 = (*((this->super_IrrlichtBase).reader)->_vptr_IIrrXMLReader[0xd])();
            iVar4 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar4),"buffer");
            if ((iVar4 == 0) && ((curMesh != (aiMesh *)0x0 || (paStack_120 != (aiMesh *)0x0)))) {
              if ((curMesh == (aiMesh *)0x0) || (paStack_120 == (aiMesh *)0x0)) {
                pLVar16 = DefaultLogger::get();
                Logger::error(pLVar16,"IRRMESH: A buffer must contain a mesh and a material");
                releaseMaterial((aiMaterial **)&curMesh);
                releaseMesh(&stack0xfffffffffffffee0);
              }
              else {
                std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                          ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                           &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(value_type *)&curMesh);
                std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&curMat,
                           &stack0xfffffffffffffee0);
              }
              curMesh = (aiMesh *)0x0;
              paStack_120 = (aiMesh *)0x0;
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::clear
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curNormals.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::clear
                        ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                         &curUVs.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::clear
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curTangents.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::clear
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &vertexFormat);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::clear
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curUV2s.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::clear
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curBitangents.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::clear
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &curColors.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            iVar4 = (*((this->super_IrrlichtBase).reader)->_vptr_IIrrXMLReader[0xd])();
            iVar4 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_00,iVar4),"material");
            if (iVar4 == 0) {
              if (curMesh != (aiMesh *)0x0) {
                pLVar16 = DefaultLogger::get();
                Logger::warn(pLVar16,"IRRMESH: Only one material description per buffer, please");
                releaseMaterial((aiMaterial **)&curMesh);
              }
              curMesh = (aiMesh *)
                        IrrlichtBase::ParseMaterial
                                  (&this->super_IrrlichtBase,
                                   (uint *)((long)&curVertices.
                                                                                                      
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
            }
            iVar4 = (*((this->super_IrrlichtBase).reader)->_vptr_IIrrXMLReader[0xd])();
            iVar4 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_01,iVar4),"vertices");
            if (iVar4 == 0) {
              pIVar7 = (this->super_IrrlichtBase).reader;
              t._0_4_ = (*pIVar7->_vptr_IIrrXMLReader[9])(pIVar7,"vertexCount");
              if ((int)t == 0) {
                pLVar16 = DefaultLogger::get();
                Logger::warn(pLVar16,"IRRMESH: Found mesh with zero vertices");
                releaseMaterial((aiMaterial **)&curMesh);
                releaseMesh(&stack0xfffffffffffffee0);
                iStack_1d4 = 0;
              }
              else {
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &curNormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)t);
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &curTangents.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)t);
                std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
                          ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                           &curUVs.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)t);
                std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &curUV2s.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)t);
                pIVar7 = (this->super_IrrlichtBase).reader;
                iVar4 = (*pIVar7->_vptr_IIrrXMLReader[8])(pIVar7,"type");
                pcStack_1e8 = (char *)CONCAT44(extraout_var_02,iVar4);
                iVar4 = ASSIMP_stricmp("2tcoords",pcStack_1e8);
                if (iVar4 == 0) {
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &vertexFormat,(long)(int)t);
                  num = 1;
                  if ((curVertices.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x100000) != 0) {
                    mat._4_4_ = 1;
                    local_1f8 = curMesh;
                    if ((curVertices.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 2) == 0) {
                      if ((curVertices.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x100) == 0) {
                        if ((curVertices.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x10000) !=
                            0) {
                          aiMaterial::AddProperty
                                    ((aiMaterial *)curMesh,(int *)((long)&mat + 4),1,"$tex.uvwsrc",1
                                     ,1);
                        }
                      }
                      else {
                        aiMaterial::AddProperty
                                  ((aiMaterial *)curMesh,(int *)((long)&mat + 4),1,"$tex.uvwsrc",6,0
                                  );
                      }
                    }
                    else {
                      aiMaterial::AddProperty
                                ((aiMaterial *)curMesh,(int *)((long)&mat + 4),1,"$tex.uvwsrc",10,0)
                      ;
                    }
                  }
                }
                else {
                  iVar4 = ASSIMP_stricmp("tangents",pcStack_1e8);
                  if (iVar4 == 0) {
                    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               &curBitangents.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)t);
                    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               &curColors.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)t);
                    num = 2;
                  }
                  else {
                    iVar4 = ASSIMP_stricmp("standard",pcStack_1e8);
                    if (iVar4 == 0) {
                      num = 0;
                    }
                    else {
                      releaseMaterial((aiMaterial **)&curMesh);
                      pLVar16 = DefaultLogger::get();
                      Logger::warn(pLVar16,"IRRMESH: Unknown vertex format");
                    }
                  }
                }
                iStack_1d4 = 1;
              }
            }
            else {
              iVar4 = (*((this->super_IrrlichtBase).reader)->_vptr_IIrrXMLReader[0xd])();
              iVar4 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_03,iVar4),"indices");
              if (iVar4 == 0) {
                bVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )&curNormals.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if ((bVar2) && (curMesh != (aiMesh *)0x0)) {
                  releaseMaterial((aiMaterial **)&curMesh);
                  sz._6_1_ = 1;
                  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_218,"IRRMESH: indices must come after vertices",
                             (allocator *)((long)&sz + 7));
                  DeadlyImportError::DeadlyImportError(pDVar6,&local_218);
                  sz._6_1_ = 0;
                  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,
                              DeadlyImportError::~DeadlyImportError);
                }
                iStack_1d4 = 2;
                paVar8 = (aiMesh *)operator_new(0x520);
                aiMesh::aiMesh(paVar8);
                pIVar7 = (this->super_IrrlichtBase).reader;
                paStack_120 = paVar8;
                uVar3 = (*pIVar7->_vptr_IIrrXMLReader[9])(pIVar7,"indexCount");
                paStack_120->mNumVertices = uVar3;
                if (paStack_120->mNumVertices == 0) {
                  pLVar16 = DefaultLogger::get();
                  Logger::warn(pLVar16,"IRRMESH: Found mesh with zero indices");
                  releaseMesh(&stack0xfffffffffffffee0);
                  releaseMaterial((aiMaterial **)&curMesh);
                  iStack_1d4 = 0;
                }
                else {
                  if (paStack_120->mNumVertices % 3 != 0) {
                    pLVar16 = DefaultLogger::get();
                    Logger::warn(pLVar16,"IRRMESH: Number if indices isn\'t divisible by 3");
                  }
                  paStack_120->mNumFaces = paStack_120->mNumVertices / 3;
                  uVar10 = (ulong)paStack_120->mNumFaces;
                  puVar9 = (ulong *)operator_new__(uVar10 << 4 | 8);
                  *puVar9 = uVar10;
                  paVar22 = (aiFace *)(puVar9 + 1);
                  if (uVar10 != 0) {
                    local_400 = paVar22;
                    do {
                      aiFace::aiFace(local_400);
                      local_400 = local_400 + 1;
                    } while (local_400 != paVar22 + uVar10);
                  }
                  paStack_120->mFaces = paVar22;
                  sVar17 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                                     ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                                      &meshes.
                                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
                  paStack_120->mMaterialIndex = (uint)sVar17;
                  paStack_120->mPrimitiveTypes = 4;
                  uVar10 = (ulong)paStack_120->mNumVertices;
                  paVar11 = (aiVector3D *)operator_new__(uVar10 * 0xc);
                  if (uVar10 != 0) {
                    local_428 = paVar11;
                    do {
                      aiVector3t<float>::aiVector3t(local_428);
                      local_428 = local_428 + 1;
                    } while (local_428 != paVar11 + uVar10);
                  }
                  paStack_120->mVertices = paVar11;
                  sVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curTangents.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curNormals.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (sVar17 == sVar12) {
                    uVar10 = (ulong)paStack_120->mNumVertices;
                    paVar11 = (aiVector3D *)operator_new__(uVar10 * 0xc);
                    if (uVar10 != 0) {
                      local_458 = paVar11;
                      do {
                        aiVector3t<float>::aiVector3t(local_458);
                        local_458 = local_458 + 1;
                      } while (local_458 != paVar11 + uVar10);
                    }
                    paStack_120->mNormals = paVar11;
                  }
                  sVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curBitangents.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curNormals.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (sVar17 == sVar12) {
                    uVar10 = (ulong)paStack_120->mNumVertices;
                    paVar11 = (aiVector3D *)operator_new__(uVar10 * 0xc);
                    if (uVar10 != 0) {
                      local_488 = paVar11;
                      do {
                        aiVector3t<float>::aiVector3t(local_488);
                        local_488 = local_488 + 1;
                      } while (local_488 != paVar11 + uVar10);
                    }
                    paStack_120->mTangents = paVar11;
                  }
                  sVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curColors.
                                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curNormals.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (sVar17 == sVar12) {
                    uVar10 = (ulong)paStack_120->mNumVertices;
                    paVar11 = (aiVector3D *)operator_new__(uVar10 * 0xc);
                    if (uVar10 != 0) {
                      local_4b8 = paVar11;
                      do {
                        aiVector3t<float>::aiVector3t(local_4b8);
                        local_4b8 = local_4b8 + 1;
                      } while (local_4b8 != paVar11 + uVar10);
                    }
                    paStack_120->mBitangents = paVar11;
                  }
                  sVar17 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                                     ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                       *)&curUVs.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curNormals.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if ((sVar17 == sVar12) && ((t._7_1_ & 1) != 0)) {
                    uVar10 = (ulong)paStack_120->mNumVertices;
                    paVar13 = (aiColor4D *)operator_new__(uVar10 << 4);
                    if (uVar10 != 0) {
                      local_4e8 = paVar13;
                      do {
                        aiColor4t<float>::aiColor4t(local_4e8);
                        local_4e8 = local_4e8 + 1;
                      } while (local_4e8 != paVar13 + uVar10);
                    }
                    paStack_120->mColors[0] = paVar13;
                  }
                  sVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curUV2s.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curNormals.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (sVar17 == sVar12) {
                    uVar10 = (ulong)paStack_120->mNumVertices;
                    paVar11 = (aiVector3D *)operator_new__(uVar10 * 0xc);
                    if (uVar10 != 0) {
                      local_518 = paVar11;
                      do {
                        aiVector3t<float>::aiVector3t(local_518);
                        local_518 = local_518 + 1;
                      } while (local_518 != paVar11 + uVar10);
                    }
                    paStack_120->mTextureCoords[0] = paVar11;
                  }
                  sVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&vertexFormat);
                  sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)&curNormals.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (sVar17 == sVar12) {
                    uVar10 = (ulong)paStack_120->mNumVertices;
                    paVar11 = (aiVector3D *)operator_new__(uVar10 * 0xc);
                    if (uVar10 != 0) {
                      local_548 = paVar11;
                      do {
                        aiVector3t<float>::aiVector3t(local_548);
                        local_548 = local_548 + 1;
                      } while (local_548 != paVar11 + uVar10);
                    }
                    paStack_120->mTextureCoords[1] = paVar11;
                  }
                }
              }
            }
          }
        } while (iVar4 != 3);
        temp.y = (float)(*((this->super_IrrlichtBase).reader)->_vptr_IIrrXMLReader[0xe])();
        temp.z = extraout_var_04;
        if (iStack_1d4 != 1) break;
        iStack_1d4 = 0;
        do {
          SkipSpacesAndLineEnd<char>((char **)&temp.y);
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&c.b);
          aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_244);
          temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.b,true);
          SkipSpaces<char>((char **)&temp.y);
          temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.a,true);
          SkipSpaces<char>((char **)&temp.y);
          temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&temp.x,true);
          SkipSpaces<char>((char **)&temp.y);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &curNormals.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&c.b);
          temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.b,true);
          SkipSpaces<char>((char **)&temp.y);
          temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.a,true);
          SkipSpaces<char>((char **)&temp.y);
          temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&temp.x,true);
          SkipSpaces<char>((char **)&temp.y);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &curTangents.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&c.b);
          local_248 = strtoul16((char *)temp._4_8_,(char **)&temp.y);
          ColorFromARGBPacked(local_248,(aiColor4D *)local_244);
          bVar2 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::empty
                            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                             &curUVs.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_59d = false;
          if (!bVar2) {
            curFace = (aiFace *)
                      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::end
                                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                                 &curUVs.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_250 = __gnu_cxx::
                        __normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                        ::operator-((__normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                                     *)&curFace,1);
            other = __gnu_cxx::
                    __normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                    ::operator*(&local_250);
            local_59d = aiColor4t<float>::operator!=((aiColor4t<float> *)local_244,other);
          }
          if (local_59d != false) {
            t._7_1_ = 1;
          }
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                    ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                     &curUVs.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_244);
          SkipSpaces<char>((char **)&temp.y);
          temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.b,true);
          SkipSpaces<char>((char **)&temp.y);
          temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.a,true);
          SkipSpaces<char>((char **)&temp.y);
          temp.x = 0.0;
          c.a = 1.0 - c.a;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &curUV2s.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&c.b);
          if (num == 1) {
            temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.b,true);
            SkipSpaces<char>((char **)&temp.y);
            temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.a,true);
            c.a = 1.0 - c.a;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &vertexFormat,(value_type *)&c.b);
          }
          else if (num == 2) {
            temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.b,true);
            SkipSpaces<char>((char **)&temp.y);
            temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&temp.x,true);
            SkipSpaces<char>((char **)&temp.y);
            temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.a,true);
            SkipSpaces<char>((char **)&temp.y);
            c.a = -c.a;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &curBitangents.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&c.b);
            temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.b,true);
            SkipSpaces<char>((char **)&temp.y);
            temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&temp.x,true);
            SkipSpaces<char>((char **)&temp.y);
            temp._4_8_ = fast_atoreal_move<float>((char *)temp._4_8_,&c.a,true);
            SkipSpaces<char>((char **)&temp.y);
            c.a = -c.a;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &curColors.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&c.b);
          }
          bVar2 = SkipLine<char>((char **)&temp.y);
        } while (bVar2);
      }
    } while (iStack_1d4 != 2);
    iStack_1d4 = 0;
    faceEnd = paStack_120->mFaces;
    pcV = (aiVector3D *)(paStack_120->mFaces + paStack_120->mNumFaces);
    pcN = paStack_120->mVertices;
    pcT = paStack_120->mNormals;
    pcB = paStack_120->mTangents;
    pcC0 = (aiColor4D *)paStack_120->mBitangents;
    pcT0 = (aiVector3D *)paStack_120->mColors[0];
    pcT1 = paStack_120->mTextureCoords[0];
    _total = paStack_120->mTextureCoords[1];
    idx_1 = 0;
    local_2a8 = 0;
    while (bVar2 = SkipSpacesAndLineEnd<char>((char **)&temp.y), bVar2) {
      if (pcV <= faceEnd) {
        pLVar16 = DefaultLogger::get();
        Logger::error(pLVar16,"IRRMESH: Too many indices");
        break;
      }
      if (idx_1 == 0) {
        faceEnd->mNumIndices = 3;
        puVar21 = (uint *)operator_new__(0xc);
        faceEnd->mIndices = puVar21;
      }
      mat_1._4_4_ = strtoul10((char *)temp._4_8_,(char **)&temp.y);
      uVar10 = (ulong)mat_1._4_4_;
      sVar17 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &curNormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar17 <= uVar10) {
        pLVar16 = DefaultLogger::get();
        Logger::error(pLVar16,"IRRMESH: Index out of range");
        mat_1._4_4_ = 0;
      }
      faceEnd->mIndices[idx_1] = local_2a8;
      local_2a8 = local_2a8 + 1;
      pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &curNormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)mat_1._4_4_);
      paVar11 = pcN + 1;
      fVar1 = pvVar14->y;
      pcN->x = pvVar14->x;
      pcN->y = fVar1;
      pcN->z = pvVar14->z;
      pcN = paVar11;
      if (pcT != (aiVector3D *)0x0) {
        pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &curTangents.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)mat_1._4_4_)
        ;
        fVar1 = pvVar14->y;
        pcT->x = pvVar14->x;
        pcT->y = fVar1;
        pcT->z = pvVar14->z;
        pcT = pcT + 1;
      }
      if (pcB != (aiVector3D *)0x0) {
        pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &curBitangents.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)mat_1._4_4_)
        ;
        fVar1 = pvVar14->y;
        pcB->x = pvVar14->x;
        pcB->y = fVar1;
        pcB->z = pvVar14->z;
        pcB = pcB + 1;
      }
      if (pcC0 != (aiColor4D *)0x0) {
        pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &curColors.
                              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)mat_1._4_4_)
        ;
        fVar1 = pvVar14->y;
        pcC0->r = pvVar14->x;
        pcC0->g = fVar1;
        pcC0->b = pvVar14->z;
        pcC0 = (aiColor4D *)&pcC0->a;
      }
      if (pcT0 != (aiVector3D *)0x0) {
        pvVar15 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                             &curUVs.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)mat_1._4_4_)
        ;
        fVar1 = pvVar15->g;
        pcT0->x = pvVar15->r;
        pcT0->y = fVar1;
        *(undefined8 *)&pcT0->z = *(undefined8 *)&pvVar15->b;
        pcT0 = (aiVector3D *)&pcT0[1].y;
      }
      if (pcT1 != (aiVector3D *)0x0) {
        pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &curUV2s.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)mat_1._4_4_)
        ;
        fVar1 = pvVar14->y;
        pcT1->x = pvVar14->x;
        pcT1->y = fVar1;
        pcT1->z = pvVar14->z;
        pcT1 = pcT1 + 1;
      }
      if (_total != (aiVector3D *)0x0) {
        pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &vertexFormat,(ulong)mat_1._4_4_);
        fVar1 = pvVar14->y;
        _total->x = pvVar14->x;
        _total->y = fVar1;
        _total->z = pvVar14->z;
        _total = _total + 1;
      }
      idx_1 = idx_1 + 1;
      if (idx_1 == 3) {
        faceEnd = faceEnd + 1;
        idx_1 = 0;
      }
    }
    if (faceEnd != (aiFace *)pcV) {
      pLVar16 = DefaultLogger::get();
      Logger::error(pLVar16,"IRRMESH: Not enough indices");
    }
    paVar8 = curMesh;
    if (((curVertices.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 1) != 0) && ((t._7_1_ & 1) == 0)
       ) {
      local_2b8 = curMesh;
      pvVar15 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                          ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                           &curUVs.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      aiMaterial::AddProperty((aiMaterial *)paVar8,&pvVar15->a,1,"$mat.opacity",0,0);
    }
  } while( true );
}

Assistant:

void IRRMeshImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open IRRMESH file " + pFile + "");

    // Construct the irrXML parser
    CIrrXML_IOStreamReader st(file.get());
    reader = createIrrXMLReader((IFileReadCallBack*) &st);

    // final data
    std::vector<aiMaterial*> materials;
    std::vector<aiMesh*>     meshes;
    materials.reserve (5);
    meshes.reserve(5);

    // temporary data - current mesh buffer
    aiMaterial* curMat  = nullptr;
    aiMesh* curMesh     = nullptr;
    unsigned int curMatFlags = 0;

    std::vector<aiVector3D> curVertices,curNormals,curTangents,curBitangents;
    std::vector<aiColor4D>  curColors;
    std::vector<aiVector3D> curUVs,curUV2s;

    // some temporary variables
    int textMeaning = 0;
    int vertexFormat = 0; // 0 = normal; 1 = 2 tcoords, 2 = tangents
    bool useColors = false;

    // Parse the XML file
    while (reader->read())  {
        switch (reader->getNodeType())  {
        case EXN_ELEMENT:

            if (!ASSIMP_stricmp(reader->getNodeName(),"buffer") && (curMat || curMesh)) {
                // end of previous buffer. A material and a mesh should be there
                if ( !curMat || !curMesh)   {
                    ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                } else {
                    materials.push_back(curMat);
                    meshes.push_back(curMesh);
                }
                curMat  = nullptr;
                curMesh = nullptr;

                curVertices.clear();
                curColors.clear();
                curNormals.clear();
                curUV2s.clear();
                curUVs.clear();
                curTangents.clear();
                curBitangents.clear();
            }


            if (!ASSIMP_stricmp(reader->getNodeName(),"material"))  {
                if (curMat) {
                    ASSIMP_LOG_WARN("IRRMESH: Only one material description per buffer, please");
                    releaseMaterial( &curMat );
                }
                curMat = ParseMaterial(curMatFlags);
            }
            /* no else here! */ if (!ASSIMP_stricmp(reader->getNodeName(),"vertices"))
            {
                int num = reader->getAttributeValueAsInt("vertexCount");

                if (!num)   {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero vertices");

                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                    textMeaning = 0;
                    continue;
                }

                curVertices.reserve(num);
                curNormals.reserve(num);
                curColors.reserve(num);
                curUVs.reserve(num);

                // Determine the file format
                const char* t = reader->getAttributeValueSafe("type");
                if (!ASSIMP_stricmp("2tcoords", t)) {
                    curUV2s.reserve (num);
                    vertexFormat = 1;

                    if (curMatFlags & AI_IRRMESH_EXTRA_2ND_TEXTURE) {
                        // *********************************************************
                        // We have a second texture! So use this UV channel
                        // for it. The 2nd texture can be either a normal
                        // texture (solid_2layer or lightmap_xxx) or a normal
                        // map (normal_..., parallax_...)
                        // *********************************************************
                        int idx = 1;
                        aiMaterial* mat = ( aiMaterial* ) curMat;

                        if (curMatFlags & AI_IRRMESH_MAT_lightmap){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_LIGHTMAP(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_normalmap_solid){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(1));
                        }
                    }
                }
                else if (!ASSIMP_stricmp("tangents", t))    {
                    curTangents.reserve (num);
                    curBitangents.reserve (num);
                    vertexFormat = 2;
                }
                else if (ASSIMP_stricmp("standard", t)) {
                    releaseMaterial( &curMat );
                    ASSIMP_LOG_WARN("IRRMESH: Unknown vertex format");
                }
                else vertexFormat = 0;
                textMeaning = 1;
            }
            else if (!ASSIMP_stricmp(reader->getNodeName(),"indices"))  {
                if (curVertices.empty() && curMat)  {
                    releaseMaterial( &curMat );
                    throw DeadlyImportError("IRRMESH: indices must come after vertices");
                }

                textMeaning = 2;

                // start a new mesh
                curMesh = new aiMesh();

                // allocate storage for all faces
                curMesh->mNumVertices = reader->getAttributeValueAsInt("indexCount");
                if (!curMesh->mNumVertices) {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero indices");

                    // mesh - away
                    releaseMesh( &curMesh );

                    // material - away
                    releaseMaterial( &curMat );

                    textMeaning = 0;
                    continue;
                }

                if (curMesh->mNumVertices % 3)  {
                    ASSIMP_LOG_WARN("IRRMESH: Number if indices isn't divisible by 3");
                }

                curMesh->mNumFaces = curMesh->mNumVertices / 3;
                curMesh->mFaces = new aiFace[curMesh->mNumFaces];

                // setup some members
                curMesh->mMaterialIndex = (unsigned int)materials.size();
                curMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // allocate storage for all vertices
                curMesh->mVertices = new aiVector3D[curMesh->mNumVertices];

                if (curNormals.size() == curVertices.size())    {
                    curMesh->mNormals = new aiVector3D[curMesh->mNumVertices];
                }
                if (curTangents.size() == curVertices.size())   {
                    curMesh->mTangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curBitangents.size() == curVertices.size()) {
                    curMesh->mBitangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curColors.size() == curVertices.size() && useColors)    {
                    curMesh->mColors[0] = new aiColor4D[curMesh->mNumVertices];
                }
                if (curUVs.size() == curVertices.size())    {
                    curMesh->mTextureCoords[0] = new aiVector3D[curMesh->mNumVertices];
                }
                if (curUV2s.size() == curVertices.size())   {
                    curMesh->mTextureCoords[1] = new aiVector3D[curMesh->mNumVertices];
                }
            }
            break;

        case EXN_TEXT:
            {
            const char* sz = reader->getNodeData();
            if (textMeaning == 1)   {
                textMeaning = 0;

                // read vertices
                do  {
                    SkipSpacesAndLineEnd(&sz);
                    aiVector3D temp;aiColor4D c;

                    // Read the vertex position
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curVertices.push_back(temp);

                    // Read the vertex normals
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curNormals.push_back(temp);

                    // read the vertex colors
                    uint32_t clr = strtoul16(sz,&sz);
                    ColorFromARGBPacked(clr,c);

                    if (!curColors.empty() && c != *(curColors.end()-1))
                        useColors = true;

                    curColors.push_back(c);
                    SkipSpaces(&sz);


                    // read the first UV coordinate set
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);
                    temp.z = 0.f;
                    temp.y = 1.f - temp.y;  // DX to OGL
                    curUVs.push_back(temp);

                    // read the (optional) second UV coordinate set
                    if (vertexFormat == 1)  {
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        temp.y = 1.f - temp.y; // DX to OGL
                        curUV2s.push_back(temp);
                    }
                    // read optional tangent and bitangent vectors
                    else if (vertexFormat == 2) {
                        // tangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curTangents.push_back(temp);

                        // bitangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curBitangents.push_back(temp);
                    }
                }

                /* IMPORTANT: We assume that each vertex is specified in one
                   line. So we can skip the rest of the line - unknown vertex
                   elements are ignored.
                 */

                while (SkipLine(&sz));
            }
            else if (textMeaning == 2)  {
                textMeaning = 0;

                // read indices
                aiFace* curFace = curMesh->mFaces;
                aiFace* const faceEnd = curMesh->mFaces  + curMesh->mNumFaces;

                aiVector3D* pcV  = curMesh->mVertices;
                aiVector3D* pcN  = curMesh->mNormals;
                aiVector3D* pcT  = curMesh->mTangents;
                aiVector3D* pcB  = curMesh->mBitangents;
                aiColor4D* pcC0  = curMesh->mColors[0];
                aiVector3D* pcT0 = curMesh->mTextureCoords[0];
                aiVector3D* pcT1 = curMesh->mTextureCoords[1];

                unsigned int curIdx = 0;
                unsigned int total = 0;
                while(SkipSpacesAndLineEnd(&sz))    {
                    if (curFace >= faceEnd) {
                        ASSIMP_LOG_ERROR("IRRMESH: Too many indices");
                        break;
                    }
                    if (!curIdx)    {
                        curFace->mNumIndices = 3;
                        curFace->mIndices = new unsigned int[3];
                    }

                    unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= curVertices.size())  {
                        ASSIMP_LOG_ERROR("IRRMESH: Index out of range");
                        idx = 0;
                    }

                    curFace->mIndices[curIdx] = total++;

                    *pcV++ = curVertices[idx];
                    if (pcN)*pcN++ = curNormals[idx];
                    if (pcT)*pcT++ = curTangents[idx];
                    if (pcB)*pcB++ = curBitangents[idx];
                    if (pcC0)*pcC0++ = curColors[idx];
                    if (pcT0)*pcT0++ = curUVs[idx];
                    if (pcT1)*pcT1++ = curUV2s[idx];

                    if (++curIdx == 3)  {
                        ++curFace;
                        curIdx = 0;
                    }
                }

                if (curFace != faceEnd)
                    ASSIMP_LOG_ERROR("IRRMESH: Not enough indices");

                // Finish processing the mesh - do some small material workarounds
                if (curMatFlags & AI_IRRMESH_MAT_trans_vertex_alpha && !useColors)  {
                    // Take the opacity value of the current material
                    // from the common vertex color alpha
                    aiMaterial* mat = (aiMaterial*)curMat;
                    mat->AddProperty(&curColors[0].a,1,AI_MATKEY_OPACITY);
                }
            }}
            break;

            default:
                // GCC complains here ...
                break;

        };
    }

    // End of the last buffer. A material and a mesh should be there
    if (curMat || curMesh)  {
        if ( !curMat || !curMesh)   {
            ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
            releaseMaterial( &curMat );
            releaseMesh( &curMesh );
        }
        else    {
            materials.push_back(curMat);
            meshes.push_back(curMesh);
        }
    }

    if (materials.empty())
        throw DeadlyImportError("IRRMESH: Unable to read a mesh from this file");


    // now generate the output scene
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        pScene->mMeshes[i] = meshes[i];

        // clean this value ...
        pScene->mMeshes[i]->mNumUVComponents[3] = 0;
    }

    pScene->mNumMaterials = (unsigned int)materials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&materials[0],sizeof(void*)*pScene->mNumMaterials);

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<IRRMesh>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // clean up and return
    delete reader;
    AI_DEBUG_INVALIDATE_PTR(reader);
}